

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O0

ktx_size_t ktxTexture2_calcFaceLodSize(ktxTexture2 *This,ktx_uint32_t level)

{
  uint in_ESI;
  long in_RDI;
  ktxFormatVersionEnum in_stack_00000010;
  ktx_uint32_t in_stack_00000014;
  ktxTexture *in_stack_00000018;
  ktx_size_t local_8;
  
  if (in_RDI == 0) {
    __assert_fail("This != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture2.c"
                  ,0x665,"ktx_size_t ktxTexture2_calcFaceLodSize(ktxTexture2 *, ktx_uint32_t)");
  }
  if (*(int *)(in_RDI + 0x88) == 0) {
    if (((*(byte *)(in_RDI + 0x21) & 1) == 0) || ((*(byte *)(in_RDI + 0x20) & 1) != 0)) {
      local_8 = *(ktx_size_t *)(*(long *)(in_RDI + 0xa0) + (ulong)in_ESI * 0x18 + 0x30);
    }
    else {
      local_8 = ktxTexture_calcImageSize(in_stack_00000018,in_stack_00000014,in_stack_00000010);
    }
    return local_8;
  }
  __assert_fail("This->supercompressionScheme == KTX_SS_NONE",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture2.c"
                ,0x666,"ktx_size_t ktxTexture2_calcFaceLodSize(ktxTexture2 *, ktx_uint32_t)");
}

Assistant:

ktx_size_t
ktxTexture2_calcFaceLodSize(ktxTexture2* This, ktx_uint32_t level)
{
    assert(This != NULL);
    assert(This->supercompressionScheme == KTX_SS_NONE);
    /*
     * For non-array cubemaps this is the size of a face. For everything
     * else it is the size of the level.
     */
    if (This->isCubemap && !This->isArray)
        return ktxTexture_calcImageSize(ktxTexture(This), level,
                                        KTX_FORMAT_VERSION_TWO);
    else
        return This->_private->_levelIndex[level].uncompressedByteLength;
}